

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int stbi_psd_test_file(FILE *f)

{
  int iVar1;
  long lVar2;
  stbi s;
  stbi local_40;
  
  lVar2 = ftell((FILE *)f);
  local_40.img_file = f;
  iVar1 = psd_test(&local_40);
  fseek((FILE *)f,(long)(int)lVar2,0);
  return iVar1;
}

Assistant:

int stbi_psd_test_file(FILE *f)
{
   stbi s;
   int r,n = ftell(f);
   start_file(&s, f);
   r = psd_test(&s);
   fseek(f,n,SEEK_SET);
   return r;
}